

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SourceMgr.cpp
# Opt level: O2

uint __thiscall llvm::SourceMgr::SrcBuffer::getLineNumber<unsigned_short>(SrcBuffer *this,char *Ptr)

{
  _Head_base<0UL,_llvm::MemoryBuffer_*,_false> _Var1;
  uint __line;
  char cVar2;
  __normal_iterator<unsigned_short_*,_std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>
  _Var3;
  ulong uVar4;
  char *pcVar5;
  size_t N;
  size_t Index;
  unsigned_short local_4a;
  vector<unsigned_short,_std::allocator<unsigned_short>_> *local_48;
  unsigned_short PtrOffset;
  undefined6 uStack_3e;
  ulong local_38;
  
  if ((ulong)(this->OffsetCache).Val.Val.Value < 8) {
    local_48 = (vector<unsigned_short,_std::allocator<unsigned_short>_> *)operator_new(0x18);
    (local_48->super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>)._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    (local_48->super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>)._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (local_48->super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>)._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    PointerUnion4<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_*,_std::vector<unsigned_short,_std::allocator<unsigned_short>_>_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*>
    ::operator=(&this->OffsetCache,&local_48);
    _Var1._M_head_impl =
         (this->Buffer)._M_t.
         super___uniq_ptr_impl<llvm::MemoryBuffer,_std::default_delete<llvm::MemoryBuffer>_>._M_t.
         super__Tuple_impl<0UL,_llvm::MemoryBuffer_*,_std::default_delete<llvm::MemoryBuffer>_>.
         super__Head_base<0UL,_llvm::MemoryBuffer_*,_false>._M_head_impl;
    pcVar5 = (_Var1._M_head_impl)->BufferStart;
    uVar4 = (long)(_Var1._M_head_impl)->BufferEnd - (long)pcVar5;
    if (0xffff < uVar4) {
      pcVar5 = "Sz <= std::numeric_limits<T>::max()";
      __line = 0x51;
      goto LAB_001547a4;
    }
    _PtrOffset = pcVar5;
    local_38 = uVar4;
    for (Index = 0; uVar4 != Index; Index = Index + 1) {
      cVar2 = StringRef::operator[]((StringRef *)&PtrOffset,Index);
      if (cVar2 == '\n') {
        local_4a = (unsigned_short)Index;
        std::vector<unsigned_short,_std::allocator<unsigned_short>_>::emplace_back<unsigned_short>
                  (local_48,&local_4a);
      }
    }
  }
  else {
    local_48 = PointerUnion4<std::vector<unsigned_char,std::allocator<unsigned_char>>*,std::vector<unsigned_short,std::allocator<unsigned_short>>*,std::vector<unsigned_int,std::allocator<unsigned_int>>*,std::vector<unsigned_long,std::allocator<unsigned_long>>*>
               ::get<std::vector<unsigned_short,std::allocator<unsigned_short>>*>
                         ((PointerUnion4<std::vector<unsigned_char,std::allocator<unsigned_char>>*,std::vector<unsigned_short,std::allocator<unsigned_short>>*,std::vector<unsigned_int,std::allocator<unsigned_int>>*,std::vector<unsigned_long,std::allocator<unsigned_long>>*>
                           *)&this->OffsetCache);
  }
  _Var1._M_head_impl =
       (this->Buffer)._M_t.
       super___uniq_ptr_impl<llvm::MemoryBuffer,_std::default_delete<llvm::MemoryBuffer>_>._M_t.
       super__Tuple_impl<0UL,_llvm::MemoryBuffer_*,_std::default_delete<llvm::MemoryBuffer>_>.
       super__Head_base<0UL,_llvm::MemoryBuffer_*,_false>._M_head_impl;
  pcVar5 = (_Var1._M_head_impl)->BufferStart;
  if ((Ptr < pcVar5) || ((_Var1._M_head_impl)->BufferEnd < Ptr)) {
    pcVar5 = "Ptr >= BufStart && Ptr <= Buffer->getBufferEnd()";
    __line = 0x5d;
  }
  else {
    uVar4 = (long)Ptr - (long)pcVar5;
    if (uVar4 < 0x10000) {
      _PtrOffset = (char *)CONCAT62(uStack_3e,(short)uVar4);
      _Var3 = std::
              __lower_bound<__gnu_cxx::__normal_iterator<unsigned_short*,std::vector<unsigned_short,std::allocator<unsigned_short>>>,unsigned_short,__gnu_cxx::__ops::_Iter_less_val>
                        ((local_48->
                         super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>).
                         _M_impl.super__Vector_impl_data._M_start,
                         (local_48->
                         super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>).
                         _M_impl.super__Vector_impl_data._M_finish);
      return (int)((ulong)((long)_Var3._M_current -
                          (long)(local_48->
                                super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>)
                                ._M_impl.super__Vector_impl_data._M_start) >> 1) + 1;
    }
    pcVar5 = "PtrDiff >= 0 && static_cast<size_t>(PtrDiff) <= std::numeric_limits<T>::max()";
    __line = 0x5f;
  }
LAB_001547a4:
  __assert_fail(pcVar5,
                "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/SourceMgr.cpp"
                ,__line,
                "unsigned int llvm::SourceMgr::SrcBuffer::getLineNumber(const char *) const [T = unsigned short]"
               );
}

Assistant:

unsigned SourceMgr::SrcBuffer::getLineNumber(const char *Ptr) const {

  // Ensure OffsetCache is allocated and populated with offsets of all the
  // '\n' bytes.
  std::vector<T> *Offsets = nullptr;
  if (OffsetCache.isNull()) {
    Offsets = new std::vector<T>();
    OffsetCache = Offsets;
    size_t Sz = Buffer->getBufferSize();
    assert(Sz <= std::numeric_limits<T>::max());
    StringRef S = Buffer->getBuffer();
    for (size_t N = 0; N < Sz; ++N) {
      if (S[N] == '\n') {
        Offsets->push_back(static_cast<T>(N));
      }
    }
  } else {
    Offsets = OffsetCache.get<std::vector<T> *>();
  }

  const char *BufStart = Buffer->getBufferStart();
  assert(Ptr >= BufStart && Ptr <= Buffer->getBufferEnd());
  ptrdiff_t PtrDiff = Ptr - BufStart;
  assert(PtrDiff >= 0 && static_cast<size_t>(PtrDiff) <= std::numeric_limits<T>::max());
  T PtrOffset = static_cast<T>(PtrDiff);

  // std::lower_bound returns the first EOL offset that's not-less-than
  // PtrOffset, meaning the EOL that _ends the line_ that PtrOffset is on
  // (including if PtrOffset refers to the EOL itself). If there's no such
  // EOL, returns end().
  auto EOL = std::lower_bound(Offsets->begin(), Offsets->end(), PtrOffset);

  // Lines count from 1, so add 1 to the distance from the 0th line.
  return (1 + (EOL - Offsets->begin()));
}